

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlTextReaderFreeDoc(xmlTextReaderPtr reader,xmlDocPtr cur)

{
  xmlDtdPtr cur_00;
  xmlDeregisterNodeFunc *pp_Var1;
  xmlDtdPtr intSubset;
  xmlDtdPtr extSubset;
  xmlDocPtr cur_local;
  xmlTextReaderPtr reader_local;
  
  if (cur != (xmlDocPtr)0x0) {
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var1 = __xmlDeregisterNodeDefaultValue(), *pp_Var1 != (xmlDeregisterNodeFunc)0x0)) {
      pp_Var1 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var1)((xmlNodePtr)cur);
    }
    if (cur->ids != (void *)0x0) {
      xmlFreeIDTable((xmlIDTablePtr)cur->ids);
    }
    cur->ids = (void *)0x0;
    if (cur->refs != (void *)0x0) {
      xmlFreeRefTable((xmlRefTablePtr)cur->refs);
    }
    cur->refs = (void *)0x0;
    intSubset = cur->extSubset;
    cur_00 = cur->intSubset;
    if (cur_00 == intSubset) {
      intSubset = (xmlDtdPtr)0x0;
    }
    if (intSubset != (xmlDtdPtr)0x0) {
      xmlUnlinkNode((xmlNodePtr)cur->extSubset);
      cur->extSubset = (_xmlDtd *)0x0;
      xmlFreeDtd(intSubset);
    }
    if (cur_00 != (xmlDtdPtr)0x0) {
      xmlUnlinkNode((xmlNodePtr)cur->intSubset);
      cur->intSubset = (_xmlDtd *)0x0;
      xmlFreeDtd(cur_00);
    }
    if (cur->children != (_xmlNode *)0x0) {
      xmlTextReaderFreeNodeList(reader,cur->children);
    }
    if (cur->version != (xmlChar *)0x0) {
      (*xmlFree)(cur->version);
    }
    if (cur->name != (char *)0x0) {
      (*xmlFree)(cur->name);
    }
    if (cur->encoding != (xmlChar *)0x0) {
      (*xmlFree)(cur->encoding);
    }
    if (cur->oldNs != (_xmlNs *)0x0) {
      xmlFreeNsList(cur->oldNs);
    }
    if (cur->URL != (xmlChar *)0x0) {
      (*xmlFree)(cur->URL);
    }
    if (cur->dict != (_xmlDict *)0x0) {
      xmlDictFree(cur->dict);
    }
    (*xmlFree)(cur);
  }
  return;
}

Assistant:

static void
xmlTextReaderFreeDoc(xmlTextReaderPtr reader, xmlDocPtr cur) {
    xmlDtdPtr extSubset, intSubset;

    if (cur == NULL) return;

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr) cur);

    /*
     * Do this before freeing the children list to avoid ID lookups
     */
    if (cur->ids != NULL) xmlFreeIDTable((xmlIDTablePtr) cur->ids);
    cur->ids = NULL;
    if (cur->refs != NULL) xmlFreeRefTable((xmlRefTablePtr) cur->refs);
    cur->refs = NULL;
    extSubset = cur->extSubset;
    intSubset = cur->intSubset;
    if (intSubset == extSubset)
	extSubset = NULL;
    if (extSubset != NULL) {
	xmlUnlinkNode((xmlNodePtr) cur->extSubset);
	cur->extSubset = NULL;
	xmlFreeDtd(extSubset);
    }
    if (intSubset != NULL) {
	xmlUnlinkNode((xmlNodePtr) cur->intSubset);
	cur->intSubset = NULL;
	xmlFreeDtd(intSubset);
    }

    if (cur->children != NULL) xmlTextReaderFreeNodeList(reader, cur->children);

    if (cur->version != NULL) xmlFree((char *) cur->version);
    if (cur->name != NULL) xmlFree((char *) cur->name);
    if (cur->encoding != NULL) xmlFree((char *) cur->encoding);
    if (cur->oldNs != NULL) xmlFreeNsList(cur->oldNs);
    if (cur->URL != NULL) xmlFree((char *) cur->URL);
    if (cur->dict != NULL) xmlDictFree(cur->dict);

    xmlFree(cur);
}